

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O1

void __thiscall
rlottie::internal::model::PathData::lerp
          (PathData *this,PathData *start,PathData *end,float t,VPath *result)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  pointer pVVar13;
  pointer pVVar14;
  pointer pVVar15;
  undefined1 auVar16 [16];
  VPathData *pVVar17;
  ulong uVar18;
  pointer pVVar19;
  void *__buf;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar20;
  int iVar21;
  size_t pts;
  ulong uVar23;
  PathData *pPVar22;
  
  pPVar22 = start;
  pVVar17 = (VPathData *)
            vcow_ptr<VPath::VPathData>::write
                      ((vcow_ptr<VPath::VPathData> *)end,(int)start,end,(size_t)result);
  iVar21 = (int)pPVar22;
  VPath::VPathData::reset(pVVar17);
  pVVar13 = (this->mPoints).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
            super__Vector_impl_data._M_start;
  pVVar19 = (this->mPoints).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pVVar13 != pVVar19) {
    pVVar14 = (start->mPoints).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
              super__Vector_impl_data._M_start;
    pVVar15 = (start->mPoints).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (pVVar14 != pVVar15) {
      uVar18 = (long)pVVar19 - (long)pVVar13 >> 3;
      uVar23 = (long)pVVar15 - (long)pVVar14 >> 3;
      if (uVar18 <= uVar23) {
        uVar23 = uVar18;
      }
      auVar16._8_8_ = 0;
      auVar16._0_8_ = uVar23;
      pts = uVar23 + 1;
      pVVar17 = (VPathData *)
                vcow_ptr<VPath::VPathData>::write
                          ((vcow_ptr<VPath::VPathData> *)end,iVar21,
                           SUB168(auVar16 * ZEXT816(0xaaaaaaaaaaaaaaab),8),0xaaaaaaaaaaaaaaab);
      VPath::VPathData::reserve(pVVar17,pts,uVar23 / 3 + 2);
      pVVar13 = (this->mPoints).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
                super__Vector_impl_data._M_start;
      pVVar19 = (start->mPoints).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
                super__Vector_impl_data._M_start;
      fVar1 = pVVar19->mx;
      fVar2 = pVVar19->my;
      fVar3 = pVVar13->mx;
      fVar4 = pVVar13->my;
      pVVar17 = (VPathData *)
                vcow_ptr<VPath::VPathData>::write
                          ((vcow_ptr<VPath::VPathData> *)end,(int)pts,__buf,(size_t)pVVar19);
      VPath::VPathData::moveTo(pVVar17,(fVar1 - fVar3) * t + fVar3,(fVar2 - fVar4) * t + fVar4);
      iVar21 = (int)pts;
      pvVar20 = extraout_RDX;
      if (1 < uVar23) {
        uVar18 = 1;
        do {
          pVVar13 = (this->mPoints).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pVVar19 = (start->mPoints).super__Vector_base<VPointF,_std::allocator<VPointF>_>._M_impl.
                    super__Vector_impl_data._M_start;
          fVar1 = pVVar19[uVar18].mx;
          fVar2 = pVVar19[uVar18].my;
          fVar3 = pVVar13[uVar18].mx;
          fVar4 = pVVar13[uVar18].my;
          fVar5 = pVVar19[uVar18 + 1].mx;
          fVar6 = pVVar13[uVar18 + 1].mx;
          fVar7 = pVVar19[uVar18 + 1].my;
          fVar8 = pVVar13[uVar18 + 1].my;
          fVar9 = pVVar19[uVar18 + 2].mx;
          fVar10 = pVVar13[uVar18 + 2].mx;
          fVar11 = pVVar19[uVar18 + 2].my;
          fVar12 = pVVar13[uVar18 + 2].my;
          pVVar17 = (VPathData *)
                    vcow_ptr<VPath::VPathData>::write
                              ((vcow_ptr<VPath::VPathData> *)end,(int)pts,pvVar20,(size_t)pVVar19);
          VPath::VPathData::cubicTo
                    (pVVar17,(fVar1 - fVar3) * t + fVar3,(fVar2 - fVar4) * t + fVar4,
                     (fVar5 - fVar6) * t + fVar6,(fVar7 - fVar8) * t + fVar8,
                     (fVar9 - fVar10) * t + fVar10,(fVar11 - fVar12) * t + fVar12);
          iVar21 = (int)pts;
          uVar18 = uVar18 + 3;
          pvVar20 = extraout_RDX_00;
        } while (uVar18 < uVar23);
      }
      if (this->mClosed != false) {
        pVVar17 = (VPathData *)
                  vcow_ptr<VPath::VPathData>::write
                            ((vcow_ptr<VPath::VPathData> *)end,iVar21,pvVar20,(size_t)pVVar19);
        VPath::VPathData::close(pVVar17,iVar21);
        return;
      }
    }
  }
  return;
}

Assistant:

static void lerp(const PathData &start, const PathData &end, float t,
                     VPath &result)
    {
        result.reset();
        // test for empty animation data.
        if (start.mPoints.empty() || end.mPoints.empty())
        {
            return;
        }
        auto size = std::min(start.mPoints.size(), end.mPoints.size());
        /* reserve exact memory requirement at once
         * ptSize = size + 1(size + close)
         * elmSize = size/3 cubic + 1 move + 1 close
         */
        result.reserve(size + 1, size / 3 + 2);
        result.moveTo(start.mPoints[0] +
                      t * (end.mPoints[0] - start.mPoints[0]));
        for (size_t i = 1; i < size; i += 3) {
            result.cubicTo(
                start.mPoints[i] + t * (end.mPoints[i] - start.mPoints[i]),
                start.mPoints[i + 1] +
                    t * (end.mPoints[i + 1] - start.mPoints[i + 1]),
                start.mPoints[i + 2] +
                    t * (end.mPoints[i + 2] - start.mPoints[i + 2]));
        }
        if (start.mClosed) result.close();
    }